

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void __thiscall diligent_spirv_cross::SPIREntryPoint::SPIREntryPoint(SPIREntryPoint *this)

{
  (this->self).id = 0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->orig_name)._M_dataplus._M_p = (pointer)&(this->orig_name).field_2;
  (this->orig_name)._M_string_length = 0;
  (this->orig_name).field_2._M_local_buf[0] = '\0';
  (this->interface_variables).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.buffer_size = 0;
  (this->interface_variables).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>.ptr =
       (TypedID<(diligent_spirv_cross::Types)2> *)&(this->interface_variables).stack_storage;
  (this->interface_variables).buffer_capacity = 8;
  (this->flags).lower = 0;
  (this->flags).higher._M_h._M_buckets = &(this->flags).higher._M_h._M_single_bucket;
  (this->flags).higher._M_h._M_bucket_count = 1;
  (this->flags).higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->flags).higher._M_h._M_element_count = 0;
  (this->flags).higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->flags).higher._M_h._M_rehash_policy._M_next_resize = 0;
  (this->flags).higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->output_vertices = 0;
  this->output_primitives = 0;
  (this->workgroup_size).x = 0;
  (this->workgroup_size).y = 0;
  (this->workgroup_size).z = 0;
  (this->workgroup_size).id_x = 0;
  (this->workgroup_size).id_y = 0;
  (this->workgroup_size).id_z = 0;
  *(undefined8 *)&(this->workgroup_size).constant = 0;
  this->model = ExecutionModelMax;
  this->geometry_passthrough = false;
  return;
}

Assistant:

TypedID(uint32_t id_)
	    : id(id_)
	{
	}